

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_demangle.h
# Opt level: O1

void cute::cute_impl_demangle::patchresultforstring(string *result)

{
  int iVar1;
  ulong uVar2;
  char *name;
  
  if ((patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_)
     , iVar1 != 0)) {
    plain_demangle_abi_cxx11_
              (&patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_,
               (cute_impl_demangle *)"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE",name);
    __cxa_atexit(std::__cxx11::string::~string,
                 &patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_);
  }
  uVar2 = std::__cxx11::string::find
                    ((char *)result,
                     (ulong)patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_.
                            _M_dataplus._M_p,0);
  while (uVar2 != 0xffffffffffffffff) {
    iVar1 = std::__cxx11::string::compare
                      ((ulong)result,
                       patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_.
                       _M_string_length + uVar2,(char *)0x2,0x158bf0);
    if (iVar1 == 0) {
      std::__cxx11::string::erase
                ((ulong)result,
                 patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_._M_string_length +
                 uVar2);
    }
    std::__cxx11::string::replace
              ((ulong)result,uVar2,
               (char *)patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_.
                       _M_string_length,0x158bf3);
    uVar2 = std::__cxx11::string::find
                      ((char *)result,
                       (ulong)patchresultforstring(std::__cxx11::string&)::stringid_abi_cxx11_.
                              _M_dataplus._M_p,0);
  }
  while (uVar2 = std::__cxx11::string::find((char *)result,0x158bff,0), uVar2 != 0xffffffffffffffff)
  {
    std::__cxx11::string::erase((ulong)result,uVar2);
  }
  return;
}

Assistant:

inline void patchresultforstring(std::string& result) {
	static const std::string stringid=plain_demangle(typeid(std::string).name());
	std::string::size_type pos=std::string::npos;
	while(std::string::npos != (pos=result.find(stringid))){
		if (!result.compare(pos+stringid.size(),2," >",2)) result.erase(pos+stringid.size(),1); // makes templates look nice
		result.replace(pos,stringid.size(),"std::string");
	}
	patch_library_namespace(result);
}